

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pagerFixMaplimit(Pager *pPager)

{
  sqlite3_io_methods *psVar1;
  sqlite3_int64 sz;
  
  psVar1 = pPager->fd->pMethods;
  if ((psVar1 != (sqlite3_io_methods *)0x0) && (2 < psVar1->iVersion)) {
    sz = pPager->szMmap;
    pPager->bUseFetch = 0 < sz;
    setGetterMethod(pPager);
    psVar1 = pPager->fd->pMethods;
    if (psVar1 != (sqlite3_io_methods *)0x0) {
      (*psVar1->xFileControl)(pPager->fd,0x12,&sz);
    }
  }
  return;
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) && fd->pMethods->iVersion>=3 ){
    sqlite3_int64 sz;
    sz = pPager->szMmap;
    pPager->bUseFetch = (sz>0);
    setGetterMethod(pPager);
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}